

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O3

void __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::binary_search_tree_kernel_2
          (binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  node *pnVar1;
  
  (this->
  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>_>
  )._vptr_enumerable = (_func_int **)&PTR__binary_search_tree_kernel_2_003104b0;
  (this->
  super_asc_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>
  ._vptr_pair_remover = (_func_int **)&PTR__binary_search_tree_kernel_2_00310510;
  (this->pool)._vptr_memory_manager_stateless_kernel_1 =
       (_func_int **)&PTR__memory_manager_stateless_kernel_1_00310b80;
  pnVar1 = (node *)operator_new(0x48);
  (pnVar1->d)._M_dataplus._M_p = (pointer)&(pnVar1->d).field_2;
  (pnVar1->d)._M_string_length = 0;
  (pnVar1->d).field_2._M_local_buf[0] = '\0';
  (pnVar1->r)._M_t.
  super___uniq_ptr_impl<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::logger::global_data::output_streambuf_container_*,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>
  .super__Head_base<0UL,_dlib::logger::global_data::output_streambuf_container_*,_false>.
  _M_head_impl = (output_streambuf_container *)0x0;
  this->NIL = pnVar1;
  this->tree_size = 0;
  this->tree_root = pnVar1;
  this->current_element = (node *)0x0;
  this->at_start_ = true;
  (this->p).
  super_map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>
  ._vptr_map_pair = (_func_int **)&PTR__map_pair_00310bb0;
  pnVar1->color = '\x01';
  pnVar1->parent = (node *)0x0;
  pnVar1->left = (node *)0x0;
  pnVar1->right = (node *)0x0;
  return;
}

Assistant:

binary_search_tree_kernel_2(
            ) :
                NIL(pool.allocate()),
                tree_size(0),
                tree_root(NIL),
                current_element(0),
                at_start_(true)
            {
                NIL->color = black;
                NIL->left = 0;
                NIL->right = 0;
                NIL->parent = 0;
            }